

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall wallet::CWallet::SignTransaction(CWallet *this,CMutableTransaction *tx)

{
  pointer pCVar1;
  CTransaction *this_00;
  pointer pCVar2;
  bool bVar3;
  uint uVar4;
  const_iterator cVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  CScript *pCVar8;
  ulong uVar9;
  pointer __k;
  long in_FS_OFFSET;
  map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  input_errors;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  coins;
  _Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  local_98;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  __k = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_start;
  pCVar1 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__k != pCVar1) {
    do {
      cVar5 = std::
              _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->mapWallet)._M_h,(key_type *)__k);
      if (cVar5.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur
          == (__node_type *)0x0) {
        uVar4 = 0;
        goto LAB_00c31d9d;
      }
      uVar9 = (ulong)(__k->prevout).n;
      this_00 = *(CTransaction **)
                 ((long)cVar5.
                        super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                        ._M_cur + 0x1c0);
      pCVar2 = (this_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = ((long)(this_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar2 >> 3) * -0x3333333333333333;
      uVar4 = 0;
      local_98._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           CONCAT44(local_98._M_impl.super__Rb_tree_header._M_header._M_left._4_4_,
                    local_98._M_impl.super__Rb_tree_header._M_header._M_left._0_4_);
      local_98._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)
           CONCAT44(local_98._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,
                    local_98._M_impl.super__Rb_tree_header._M_header._M_right._0_4_);
      if (uVar7 < uVar9 || uVar7 - uVar9 == 0) goto LAB_00c31d9d;
      if (*(char *)((long)cVar5.
                          super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                          ._M_cur + 0x1f8) == '\0') {
        uVar4 = *(int *)((long)cVar5.
                               super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                               ._M_cur + 0x1f0) * 2;
      }
      bVar3 = CTransaction::IsCoinBase(this_00);
      pCVar8 = &pCVar2[uVar9].scriptPubKey;
      local_98._M_impl._0_8_ = *(undefined8 *)((long)(pCVar8 + -1) + 0x18);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 &local_98._M_impl.super__Rb_tree_header,&pCVar8->super_CScriptBase);
      local_98._M_impl.super__Rb_tree_header._M_node_count =
           CONCAT44(local_98._M_impl.super__Rb_tree_header._M_node_count._4_4_,uVar4 | bVar3);
      pmVar6 = std::
               map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
               ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                             *)&local_68,&__k->prevout);
      (pmVar6->out).nValue = local_98._M_impl._0_8_;
      pCVar8 = &(pmVar6->out).scriptPubKey;
      if (0x1c < (pmVar6->out).scriptPubKey.super_CScriptBase._size) {
        free((pCVar8->super_CScriptBase)._union.indirect_contents.indirect);
      }
      *(ulong *)((long)&(pmVar6->out).scriptPubKey.super_CScriptBase._union + 0xc) =
           CONCAT44(local_98._M_impl.super__Rb_tree_header._M_header._M_left._0_4_,
                    local_98._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_);
      *(ulong *)((long)&(pmVar6->out).scriptPubKey.super_CScriptBase._union + 0x14) =
           CONCAT44(local_98._M_impl.super__Rb_tree_header._M_header._M_right._0_4_,
                    local_98._M_impl.super__Rb_tree_header._M_header._M_left._4_4_);
      (pCVar8->super_CScriptBase)._union.indirect_contents.indirect =
           (char *)CONCAT44(local_98._M_impl.super__Rb_tree_header._M_header._4_4_,
                            local_98._M_impl.super__Rb_tree_header._M_header._M_color);
      *(ulong *)((long)&(pmVar6->out).scriptPubKey.super_CScriptBase._union + 8) =
           CONCAT44(local_98._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                    local_98._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_);
      (pmVar6->out).scriptPubKey.super_CScriptBase._size =
           local_98._M_impl.super__Rb_tree_header._M_header._M_right._4_4_;
      local_98._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = 0;
      *(undefined4 *)&pmVar6->field_0x28 =
           (undefined4)local_98._M_impl.super__Rb_tree_header._M_node_count;
      __k = __k + 1;
    } while (__k != pCVar1);
  }
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar3 = SignTransaction(this,tx,(map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                                   *)&local_68,0,
                          (map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                           *)&local_98);
  uVar4 = (uint)bVar3;
  std::
  _Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  ::~_Rb_tree(&local_98);
LAB_00c31d9d:
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  ::~_Rb_tree(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return SUB41(uVar4,0);
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::SignTransaction(CMutableTransaction& tx) const
{
    AssertLockHeld(cs_wallet);

    // Build coins map
    std::map<COutPoint, Coin> coins;
    for (auto& input : tx.vin) {
        const auto mi = mapWallet.find(input.prevout.hash);
        if(mi == mapWallet.end() || input.prevout.n >= mi->second.tx->vout.size()) {
            return false;
        }
        const CWalletTx& wtx = mi->second;
        int prev_height = wtx.state<TxStateConfirmed>() ? wtx.state<TxStateConfirmed>()->confirmed_block_height : 0;
        coins[input.prevout] = Coin(wtx.tx->vout[input.prevout.n], prev_height, wtx.IsCoinBase());
    }
    std::map<int, bilingual_str> input_errors;
    return SignTransaction(tx, coins, SIGHASH_DEFAULT, input_errors);
}